

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O1

int __thiscall crnlib::dynamic_stream::open(dynamic_stream *this,char *__file,int __oflag,...)

{
  undefined1 *puVar1;
  uint uVar2;
  uchar *p;
  dynamic_string *pdVar3;
  attribs_t in_CX;
  uint min_new_capacity;
  char *p_00;
  
  (*(this->super_data_stream)._vptr_data_stream[3])();
  puVar1 = &(this->super_data_stream).field_0x1a;
  *puVar1 = *puVar1 | 1;
  p = (this->m_buf).m_p;
  if (p != (uchar *)0x0) {
    crnlib_free(p);
    (this->m_buf).m_p = (uchar *)0x0;
    (this->m_buf).m_size = 0;
    (this->m_buf).m_capacity = 0;
  }
  uVar2 = (this->m_buf).m_size;
  min_new_capacity = (uint)__file;
  if (uVar2 != min_new_capacity) {
    if (uVar2 <= min_new_capacity) {
      if ((this->m_buf).m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_buf,min_new_capacity,uVar2 + 1 == min_new_capacity,1
                   ,(object_mover)0x0,false);
      }
      uVar2 = (this->m_buf).m_size;
      memset((this->m_buf).m_p + uVar2,0,(ulong)(min_new_capacity - uVar2));
    }
    (this->m_buf).m_size = min_new_capacity;
  }
  this->m_ofs = 0;
  p_00 = "dynamic_stream";
  if (___oflag != (char *)0x0) {
    p_00 = ___oflag;
  }
  pdVar3 = dynamic_string::set(&(this->super_data_stream).m_name,p_00,0xffffffff);
  (this->super_data_stream).m_attribs = in_CX;
  return (int)CONCAT71((int7)((ulong)pdVar3 >> 8),1);
}

Assistant:

bool open(uint initial_size = 0, const char* pName = "dynamic_stream", uint attribs = cDataStreamSeekable | cDataStreamWritable | cDataStreamReadable) {
    close();

    m_opened = true;
    m_buf.clear();
    m_buf.resize(initial_size);
    m_ofs = 0;
    m_name.set(pName ? pName : "dynamic_stream");
    m_attribs = static_cast<attribs_t>(attribs);
    return true;
  }